

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void QPDFObjectHandle::parseContentStream_data
               (shared_ptr<Buffer> *stream_data,string *description,ParserCallbacks *callbacks,
               QPDF *context)

{
  bool bVar1;
  token_type_e tVar2;
  element_type *this;
  size_t sVar3;
  element_type *buf;
  size_t sVar4;
  qpdf_offset_t qVar5;
  size_t sVar6;
  string *value;
  size_t __nbytes;
  bool local_3fa;
  QPDFObjectHandle local_388;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  QPDFExc local_328;
  long local_2a8;
  undefined1 local_29a;
  byte local_299;
  undefined1 local_298 [6];
  char ch;
  QPDFObjectHandle local_278;
  long local_268;
  size_t local_260;
  size_t length;
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  local_250;
  undefined1 local_240 [8];
  QPDFObjectHandle obj;
  qpdf_offset_t offset;
  string local_220;
  qpdf_offset_t local_200;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  sp_description;
  undefined1 local_1b0 [8];
  Tokenizer tokenizer;
  BufferInputSource input;
  size_t stream_length;
  QPDF *context_local;
  ParserCallbacks *callbacks_local;
  string *description_local;
  shared_ptr<Buffer> *stream_data_local;
  
  this = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    stream_data);
  sVar3 = Buffer::getSize(this);
  buf = std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                  (&stream_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  BufferInputSource::BufferInputSource
            ((BufferInputSource *)&tokenizer.digit_count,description,buf,false);
  ::qpdf::Tokenizer::Tokenizer((Tokenizer *)local_1b0);
  ::qpdf::Tokenizer::allowEOF((Tokenizer *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"content",&local_1f1);
  QPDFParser::make_description((QPDFParser *)local_1d0,description,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  do {
    local_200 = BufferInputSource::tell((BufferInputSource *)&tokenizer.digit_count);
    sVar4 = QIntC::to_size<long_long>(&local_200);
    if (sVar3 <= sVar4) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"content",(allocator<char> *)((long)&offset + 7));
    ::qpdf::Tokenizer::nextToken
              ((Tokenizer *)local_1b0,(InputSource *)&tokenizer.digit_count,&local_220,1);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)((long)&offset + 7));
    obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            InputSource::getLastOffset((InputSource *)&tokenizer.digit_count);
    BufferInputSource::seek
              ((BufferInputSource *)&tokenizer.digit_count,
               (qpdf_offset_t)
               obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi,0);
    std::
    shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
    ::shared_ptr(&local_250,
                 (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                  *)local_1d0);
    QPDFParser::parse_content
              ((QPDFParser *)local_240,(InputSource *)&tokenizer.digit_count,&local_250,
               (Tokenizer *)local_1b0,context);
    std::
    shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
    ::~shared_ptr(&local_250);
    bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_240);
    if (bVar1) {
      qVar5 = BufferInputSource::tell((BufferInputSource *)&tokenizer.digit_count);
      local_268 = qVar5 - (long)obj.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
      local_260 = QIntC::to_size<long_long>(&local_268);
      QPDFObjectHandle(&local_278,(QPDFObjectHandle *)local_240);
      sVar6 = QIntC::to_size<long_long>
                        ((longlong *)
                         &obj.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      sVar4 = local_260;
      (*callbacks->_vptr_ParserCallbacks[3])(callbacks,&local_278,sVar6,local_260);
      ~QPDFObjectHandle(&local_278);
      local_299 = 0;
      bVar1 = isOperator((QPDFObjectHandle *)local_240);
      __nbytes = CONCAT71((int7)(sVar4 >> 8),bVar1);
      local_3fa = false;
      if (bVar1) {
        getOperatorValue_abi_cxx11_((string *)local_298,(QPDFObjectHandle *)local_240);
        local_299 = 1;
        local_3fa = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_298,"ID");
      }
      if ((local_299 & 1) != 0) {
        std::__cxx11::string::~string((string *)local_298);
      }
      if (local_3fa != false) {
        BufferInputSource::read
                  ((BufferInputSource *)&tokenizer.digit_count,(int)&local_29a,(void *)0x1,__nbytes)
        ;
        ::qpdf::Tokenizer::expectInlineImage
                  ((Tokenizer *)local_1b0,(InputSource *)&tokenizer.digit_count);
        ::qpdf::Tokenizer::nextToken
                  ((Tokenizer *)local_1b0,(InputSource *)&tokenizer.digit_count,description,0);
        obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             InputSource::getLastOffset((InputSource *)&tokenizer.digit_count);
        qVar5 = BufferInputSource::tell((BufferInputSource *)&tokenizer.digit_count);
        local_2a8 = qVar5 - (long)obj.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
        local_260 = QIntC::to_size<long_long>(&local_2a8);
        tVar2 = ::qpdf::Tokenizer::getType((Tokenizer *)local_1b0);
        if (tVar2 == tt_bad) {
          QTC::TC("qpdf","QPDFObjectHandle EOF in inline image",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"stream data",&local_349);
          qVar5 = BufferInputSource::tell((BufferInputSource *)&tokenizer.digit_count);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_370,"EOF found while reading inline image",&local_371);
          QPDFExc::QPDFExc(&local_328,qpdf_e_damaged_pdf,description,&local_348,qVar5,&local_370);
          warn(context,&local_328);
          QPDFExc::~QPDFExc(&local_328);
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator(&local_371);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator(&local_349);
        }
        else {
          QTC::TC("qpdf","QPDFObjectHandle inline image token",0);
          value = ::qpdf::Tokenizer::getValue_abi_cxx11_((Tokenizer *)local_1b0);
          newInlineImage(&local_388,value);
          sVar4 = QIntC::to_size<long_long>
                            ((longlong *)
                             &obj.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
          (*callbacks->_vptr_ParserCallbacks[3])(callbacks,&local_388,sVar4,local_260);
          ~QPDFObjectHandle(&local_388);
        }
      }
      length._4_4_ = 0;
    }
    else {
      length._4_4_ = 3;
    }
    ~QPDFObjectHandle((QPDFObjectHandle *)local_240);
  } while (length._4_4_ == 0);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                 *)local_1d0);
  ::qpdf::Tokenizer::~Tokenizer((Tokenizer *)local_1b0);
  BufferInputSource::~BufferInputSource((BufferInputSource *)&tokenizer.digit_count);
  return;
}

Assistant:

void
QPDFObjectHandle::parseContentStream_data(
    std::shared_ptr<Buffer> stream_data,
    std::string const& description,
    ParserCallbacks* callbacks,
    QPDF* context)
{
    size_t stream_length = stream_data->getSize();
    auto input = BufferInputSource(description, stream_data.get());
    Tokenizer tokenizer;
    tokenizer.allowEOF();
    auto sp_description = QPDFParser::make_description(description, "content");
    while (QIntC::to_size(input.tell()) < stream_length) {
        // Read a token and seek to the beginning. The offset we get from this process is the
        // beginning of the next non-ignorable (space, comment) token. This way, the offset and
        // don't including ignorable content.
        tokenizer.nextToken(input, "content", true);
        qpdf_offset_t offset = input.getLastOffset();
        input.seek(offset, SEEK_SET);
        auto obj = QPDFParser::parse_content(input, sp_description, tokenizer, context);
        if (!obj) {
            // EOF
            break;
        }
        size_t length = QIntC::to_size(input.tell() - offset);

        callbacks->handleObject(obj, QIntC::to_size(offset), length);
        if (obj.isOperator() && (obj.getOperatorValue() == "ID")) {
            // Discard next character; it is the space after ID that terminated the token.  Read
            // until end of inline image.
            char ch;
            input.read(&ch, 1);
            tokenizer.expectInlineImage(input);
            tokenizer.nextToken(input, description);
            offset = input.getLastOffset();
            length = QIntC::to_size(input.tell() - offset);
            if (tokenizer.getType() == QPDFTokenizer::tt_bad) {
                QTC::TC("qpdf", "QPDFObjectHandle EOF in inline image");
                warn(
                    context,
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        description,
                        "stream data",
                        input.tell(),
                        "EOF found while reading inline image"));
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle inline image token");
                callbacks->handleObject(
                    QPDFObjectHandle::newInlineImage(tokenizer.getValue()),
                    QIntC::to_size(offset),
                    length);
            }
        }
    }
}